

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::CalcAssemblyQDot
               (Model *model,VectorNd *Q,VectorNd *QDotInit,ConstraintSet *cs,VectorNd *QDot,
               VectorNd *weights)

{
  double *pdVar1;
  uint uVar2;
  double dVar3;
  RBDLDofMismatchError *pRVar4;
  double *pdVar5;
  ulong uVar6;
  ActualDstType actualDst;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  Index row;
  Index othersize;
  long lVar11;
  VectorNd x;
  VectorNd b;
  MatrixNd A;
  MatrixNd constraintJac;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_199;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_188;
  MatrixNd local_170;
  MatrixNd local_158;
  VectorNd *local_140;
  VectorNd *local_138;
  double *local_130;
  ulong local_128;
  ulong local_120;
  MatrixNd *local_118;
  ulong local_110;
  undefined8 local_108;
  long local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  SrcEvaluatorType local_78;
  DstEvaluatorType local_68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_50;
  
  uVar9 = (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_128 = (ulong)model->dof_count;
  if (uVar9 != local_128) {
    pRVar4 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Incorrect QDot vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar4,&local_98);
    __cxa_throw(pRVar4,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  if ((Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)model->q_size) {
    pRVar4 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Incorrect Q vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar4,&local_b8);
    __cxa_throw(pRVar4,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  if ((QDotInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar9) {
    pRVar4 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Incorrect QDotInit vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar4,&local_d8);
    __cxa_throw(pRVar4,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_140 = QDotInit;
  local_138 = Q;
  if ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      uVar9) {
    local_130 = (double *)(*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2);
    local_120 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_158,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_130);
    local_130 = (double *)
                ((ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2));
    local_120 = 0;
    local_128 = (ulong)local_130;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_170,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_130);
    lVar11 = (ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2);
    local_188.m_storage.m_data = (double *)0x0;
    local_188.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_188,lVar11,1);
    if (local_188.m_storage.m_rows != lVar11) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_188,lVar11,1);
    }
    if (0 < local_188.m_storage.m_rows) {
      memset(local_188.m_storage.m_data,0,local_188.m_storage.m_rows << 3);
    }
    lVar11 = (ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2);
    local_198.m_storage.m_data = (double *)0x0;
    local_198.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,lVar11,1);
    if (local_198.m_storage.m_rows != lVar11) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,lVar11,1);
    }
    if (0 < local_198.m_storage.m_rows) {
      memset(local_198.m_storage.m_data,0,local_198.m_storage.m_rows << 3);
    }
    lVar11 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (0 < lVar11) {
      pdVar8 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar7 = (local_140->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      uVar9 = 0;
      pdVar5 = local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data;
      do {
        *pdVar5 = pdVar8[uVar9];
        local_188.m_storage.m_data[uVar9] = pdVar8[uVar9] * pdVar7[uVar9];
        uVar9 = uVar9 + 1;
        pdVar5 = pdVar5 + local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_rows + 1;
      } while ((long)(uVar9 & 0xffffffff) < lVar11);
    }
    CalcConstraintsJacobian(model,local_138,cs,&local_158,true);
    local_120 = (ulong)model->dof_count;
    local_128 = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
    local_130 = local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data + local_120;
    local_118 = &local_170;
    local_108 = 0;
    local_100 = local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
    local_50.m_src = &local_78;
    local_78.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d
    .data = local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data;
    local_78.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d
    .m_outerStride =
         local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    local_50.m_dst = &local_68;
    local_68.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_outerStride.m_value =
         local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    local_50.m_functor = &local_199;
    local_110 = local_120;
    local_68.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_data = local_130;
    local_50.m_dstExpr = (DstXprType *)&local_130;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_50);
    lVar11 = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
    if (0 < lVar11) {
      uVar2 = model->dof_count;
      pdVar7 = local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data + local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows * (ulong)uVar2;
      lVar10 = 0;
      pdVar8 = local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data;
      do {
        if (uVar2 != 0) {
          uVar9 = 0;
          pdVar5 = pdVar8;
          do {
            pdVar7[uVar9] = *pdVar5;
            uVar9 = uVar9 + 1;
            pdVar5 = pdVar5 + local_158.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          } while (uVar2 != uVar9);
        }
        lVar10 = lVar10 + 1;
        pdVar8 = pdVar8 + 1;
        pdVar7 = pdVar7 + local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_rows;
      } while (lVar10 != lVar11);
    }
    SolveLinearSystem(&local_170,(VectorNd *)&local_188,(VectorNd *)&local_198,*(LinearSolver *)cs);
    pdVar8 = local_198.m_storage.m_data;
    if ((QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        (ulong)model->dof_count) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (ulong)model->dof_count,1);
    }
    pdVar7 = (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    uVar9 = (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    uVar6 = uVar9 & 0xfffffffffffffffe;
    if (0 < (long)uVar6) {
      lVar11 = 0;
      do {
        pdVar5 = pdVar8 + lVar11;
        dVar3 = pdVar5[1];
        pdVar1 = pdVar7 + lVar11;
        *pdVar1 = *pdVar5;
        pdVar1[1] = dVar3;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)uVar6);
    }
    if (uVar6 != uVar9) {
      do {
        pdVar7[uVar6] = pdVar8[uVar6];
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)uVar9);
    }
    free(local_198.m_storage.m_data);
    free(local_188.m_storage.m_data);
    free(local_170.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free(local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    return;
  }
  pRVar4 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Incorrect weight vector size.\n","");
  Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar4,&local_f8);
  __cxa_throw(pRVar4,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

RBDL_DLLAPI
void CalcAssemblyQDot (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotInit,
  ConstraintSet &cs,
  Math::VectorNd &QDot,
  const Math::VectorNd &weights
)
{
  if(QDot.size() != model.dof_count) {
    throw Errors::RBDLDofMismatchError("Incorrect QDot vector size.\n");
  }
  if(Q.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect Q vector size.\n");
  }
  if(QDotInit.size() != QDot.size()) {
    throw Errors::RBDLDofMismatchError("Incorrect QDotInit vector size.\n");
  }
  if(weights.size() != QDot.size()) {
    throw Errors::RBDLDofMismatchError("Incorrect weight vector size.\n");
  }

  // Initialize variables.
  MatrixNd constraintJac = MatrixNd::Zero(cs.size(), model.dof_count);
  MatrixNd A = MatrixNd::Zero(cs.size() + model.dof_count, cs.size()
                              + model.dof_count);
  VectorNd b = VectorNd::Zero(cs.size() + model.dof_count);
  VectorNd x = VectorNd::Zero(cs.size() + model.dof_count);

  // The top-left block is the weight matrix and is constant.
  for(unsigned int i = 0; i < weights.size(); ++i) {
    A(i,i) = weights[i];
    b[i] = weights[i] * QDotInit[i];
  }
  CalcConstraintsJacobian (model, Q, cs, constraintJac);
  A.block (model.dof_count, 0, cs.size(), model.dof_count) = constraintJac;
  A.block (0, model.dof_count, model.dof_count, cs.size())
    = constraintJac.transpose();

  // Solve the sistem A*x = b.
  SolveLinearSystem (A, b, x, cs.linear_solver);

  // Copy the result to the output variable.
  QDot = x.block (0, 0, model.dof_count, 1);
}